

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_extract_all.cpp
# Opt level: O3

void duckdb::ExtractSingleTuple
               (string_t *string,RE2 *pattern,int32_t group,RegexStringPieceArgs *args,
               Vector *result,idx_t row)

{
  data_ptr_t pdVar1;
  long lVar2;
  undefined4 *__src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Vector *vec;
  bool bVar6;
  Vector *vector;
  idx_t size;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  InvalidInputException *this_00;
  uint uVar9;
  idx_t idx_in_entry;
  ulong uVar10;
  data_ptr_t pdVar11;
  long lVar12;
  long *plVar13;
  ulong uVar14;
  idx_t startpos;
  StringPiece input;
  string local_b8;
  Vector *local_98;
  int32_t local_8c;
  RE2 *local_88;
  idx_t local_80;
  idx_t local_78;
  StringPiece local_70;
  buffer_ptr<ValidityBuffer> *local_60;
  long *local_58;
  long local_50;
  ulong local_48;
  idx_t local_40;
  idx_t local_38;
  
  local_70.size_ = (size_type)(string->value).pointer.length;
  if (local_70.size_ < 0xd) {
    local_70.data_ = (const_pointer)((long)&string->value + 4);
  }
  else {
    local_70.data_ = (string->value).pointer.ptr;
  }
  local_98 = result;
  local_88 = pattern;
  vector = ListVector::GetEntry(result);
  pdVar11 = vector->data;
  FlatVector::VerifyFlatVector(vector);
  size = ListVector::GetListSize(result);
  local_80 = ListVector::GetListCapacity(result);
  plVar13 = (long *)(result->data + row * 0x10);
  *(idx_t *)(result->data + row * 0x10) = size;
  if (group < 0) {
    plVar13[1] = 0;
  }
  else {
    local_40 = args->size;
    local_78 = 0;
    bVar6 = ExtractAll(&local_70,local_88,&local_78,args->group_buffer,(int)local_40);
    if (bVar6) {
      local_48 = (ulong)(uint)group;
      local_60 = &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar10 = size << 4 | 4;
      local_50 = local_48 << 4;
      lVar12 = 0;
      local_8c = group;
      local_58 = plVar13;
      do {
        uVar14 = size;
        vec = local_98;
        bVar6 = lVar12 == 0;
        lVar12 = lVar12 + -1;
        if (bVar6 && local_40 < local_48) {
          this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"Pattern has %d groups. Cannot access group %d","");
          InvalidInputException::InvalidInputException<unsigned_long,int>
                    (this_00,&local_b8,args->size,local_8c);
          __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        if (local_80 <= uVar14 + 1) {
          ListVector::Reserve(local_98,local_80 * 2);
          local_80 = ListVector::GetListCapacity(vec);
          pdVar11 = vector->data;
        }
        lVar2 = *(long *)((long)&args->group_buffer->size_ + local_50);
        plVar13 = (long *)((long)&args->group_buffer->data_ + local_50);
        if (lVar2 == 0) {
          local_b8._M_string_length._0_4_ = 0;
          local_b8._M_dataplus._M_p._0_4_ = 0;
          local_b8._M_dataplus._M_p._4_4_ = 0;
          pdVar1 = pdVar11 + (uVar10 - 4);
          pdVar1[0] = '\0';
          pdVar1[1] = '\0';
          pdVar1[2] = '\0';
          pdVar1[3] = '\0';
          pdVar1 = pdVar11 + uVar10;
          pdVar1[0] = '\0';
          pdVar1[1] = '\0';
          pdVar1[2] = '\0';
          pdVar1[3] = '\0';
          pdVar1[4] = '\0';
          pdVar1[5] = '\0';
          pdVar1[6] = '\0';
          pdVar1[7] = '\0';
          pdVar1 = pdVar11 + uVar10 + 8;
          pdVar1[0] = '\0';
          pdVar1[1] = '\0';
          pdVar1[2] = '\0';
          pdVar1[3] = '\0';
          if (*plVar13 == 0) {
            _Var8._M_head_impl =
                 (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var8._M_head_impl == (unsigned_long *)0x0) {
              local_38 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_b8,&local_38);
              peVar4 = (element_type *)
                       CONCAT44(local_b8._M_dataplus._M_p._4_4_,local_b8._M_dataplus._M_p._0_4_);
              p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_b8._M_string_length._4_4_,
                                (undefined4)local_b8._M_string_length);
              local_b8._M_dataplus._M_p._0_4_ = 0;
              local_b8._M_dataplus._M_p._4_4_ = 0;
              local_b8._M_string_length._0_4_ = 0;
              local_b8._M_string_length._4_4_ = 0;
              this = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar4;
              (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var5;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    CONCAT44(local_b8._M_string_length._4_4_,(undefined4)local_b8._M_string_length)
                    != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             CONCAT44(local_b8._M_string_length._4_4_,
                                      (undefined4)local_b8._M_string_length));
                }
              }
              pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                 (local_60);
              _Var8._M_head_impl =
                   (pTVar7->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var8._M_head_impl;
            }
            bVar3 = (byte)uVar14 & 0x3f;
            _Var8._M_head_impl[uVar14 >> 6] =
                 _Var8._M_head_impl[uVar14 >> 6] &
                 (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
          }
        }
        else {
          __src = (undefined4 *)*plVar13;
          uVar9 = (uint)lVar2;
          if (uVar9 < 0xd) {
            local_b8._M_string_length._0_4_ = 0;
            local_b8._M_dataplus._M_p._0_4_ = 0;
            local_b8._M_dataplus._M_p._4_4_ = 0;
            if (uVar9 != 0) {
              switchD_012bc561::default(&local_b8,__src,(ulong)(uVar9 & 0xf));
            }
          }
          else {
            local_b8._M_dataplus._M_p._0_4_ = *__src;
            local_b8._M_dataplus._M_p._4_4_ = SUB84(__src,0);
            local_b8._M_string_length._0_4_ = (undefined4)((ulong)__src >> 0x20);
          }
          *(uint *)(pdVar11 + (uVar10 - 4)) = uVar9;
          *(ulong *)(pdVar11 + uVar10) =
               CONCAT44(local_b8._M_dataplus._M_p._4_4_,local_b8._M_dataplus._M_p._0_4_);
          *(undefined4 *)(pdVar11 + uVar10 + 8) = (undefined4)local_b8._M_string_length;
        }
        if (local_70.size_ < local_78) break;
        bVar6 = ExtractAll(&local_70,local_88,&local_78,args->group_buffer,(int)args->size);
        uVar10 = uVar10 + 0x10;
        size = uVar14 + 1;
      } while (bVar6);
      size = uVar14 + 1;
      plVar13 = local_58;
    }
    plVar13[1] = size - *plVar13;
    ListVector::SetListSize(local_98,size);
  }
  return;
}

Assistant:

void ExtractSingleTuple(const string_t &string, duckdb_re2::RE2 &pattern, int32_t group, RegexStringPieceArgs &args,
                        Vector &result, idx_t row) {
	auto input = CreateStringPiece(string);

	auto &child_vector = ListVector::GetEntry(result);
	auto list_content = FlatVector::GetData<string_t>(child_vector);
	auto &child_validity = FlatVector::Validity(child_vector);

	auto current_list_size = ListVector::GetListSize(result);
	auto current_list_capacity = ListVector::GetListCapacity(result);

	auto result_data = FlatVector::GetData<list_entry_t>(result);
	auto &list_entry = result_data[row];
	list_entry.offset = current_list_size;

	if (group < 0) {
		list_entry.length = 0;
		return;
	}
	// If the requested group index is out of bounds
	// we want to throw only if there is a match
	bool throw_on_group_found = (idx_t)group > args.size;

	idx_t startpos = 0;
	for (idx_t iteration = 0;
	     ExtractAll(input, pattern, &startpos, args.group_buffer, UnsafeNumericCast<int>(args.size)); iteration++) {
		if (!iteration && throw_on_group_found) {
			throw InvalidInputException("Pattern has %d groups. Cannot access group %d", args.size, group);
		}

		// Make sure we have enough room for the new entries
		if (current_list_size + 1 >= current_list_capacity) {
			ListVector::Reserve(result, current_list_capacity * 2);
			current_list_capacity = ListVector::GetListCapacity(result);
			list_content = FlatVector::GetData<string_t>(child_vector);
		}

		// Write the captured groups into the list-child vector
		auto &match_group = args.group_buffer[group];

		idx_t child_idx = current_list_size;
		if (match_group.empty()) {
			// This group was not matched
			list_content[child_idx] = string_t(string.GetData(), 0);
			if (match_group.begin() == nullptr) {
				// This group is optional
				child_validity.SetInvalid(child_idx);
			}
		} else {
			// Every group is a substring of the original, we can find out the offset using the pointer
			// the 'match_group' address is guaranteed to be bigger than that of the source
			D_ASSERT(const_char_ptr_cast(match_group.begin()) >= string.GetData());
			auto offset = UnsafeNumericCast<idx_t>(match_group.begin() - string.GetData());
			list_content[child_idx] =
			    string_t(string.GetData() + offset, UnsafeNumericCast<uint32_t>(match_group.size()));
		}
		current_list_size++;
		if (startpos > input.size()) {
			// Empty match found at the end of the string
			break;
		}
	}
	list_entry.length = current_list_size - list_entry.offset;
	ListVector::SetListSize(result, current_list_size);
}